

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# locale.h
# Opt level: O0

basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
fmt::v5::internal::vformat<char>
          (locale *loc,basic_string_view<char> format_str,
          basic_format_args<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
          args)

{
  basic_format_args<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
  args_00;
  iterator this;
  unsigned_long_long in_RCX;
  basic_memory_buffer<char,_500UL,_std::allocator<char>_> *in_RDX;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  basic_buffer<char> *in_R9;
  basic_memory_buffer<char,_500UL,_std::allocator<char>_> buffer;
  allocator<char> *in_stack_fffffffffffffd48;
  basic_memory_buffer<char,_500UL,_std::allocator<char>_> *in_stack_fffffffffffffd50;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>_2
  in_stack_fffffffffffffd98;
  basic_string_view<char> in_stack_fffffffffffffda0;
  allocator<char> local_249 [553];
  basic_buffer<char> *pbStack_20;
  basic_memory_buffer<char,_500UL,_std::allocator<char>_> *local_18;
  unsigned_long_long uStack_10;
  
  pbStack_20 = in_R9;
  local_18 = in_RDX;
  uStack_10 = in_RCX;
  std::allocator<char>::allocator();
  basic_memory_buffer<char,_500UL,_std::allocator<char>_>::basic_memory_buffer
            (in_stack_fffffffffffffd50,in_stack_fffffffffffffd48);
  std::allocator<char>::~allocator(local_249);
  args_00.field_1.args_ = in_stack_fffffffffffffd98.args_;
  args_00.types_ = uStack_10;
  this = vformat_to<char>((locale *)local_18,pbStack_20,in_stack_fffffffffffffda0,args_00);
  to_string<char,500ul>(local_18);
  basic_memory_buffer<char,_500UL,_std::allocator<char>_>::~basic_memory_buffer
            ((basic_memory_buffer<char,_500UL,_std::allocator<char>_> *)this.container);
  return in_RDI;
}

Assistant:

std::basic_string<Char> vformat(
    const std::locale &loc, basic_string_view<Char> format_str,
    basic_format_args<typename buffer_context<Char>::type> args) {
  basic_memory_buffer<Char> buffer;
  internal::vformat_to(loc, buffer, format_str, args);
  return fmt::to_string(buffer);
}